

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCore.c
# Opt level: O0

int Lpk_ExploreCut(Lpk_Man_t *p,Lpk_Cut_t *pCut,Kit_DsdNtk_t *pNtk)

{
  float fVar1;
  Abc_Ntk_t *pAVar2;
  If_Man_t *pIVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Kit_DsdObj_t *pKVar7;
  If_Obj_t *pIVar8;
  Abc_Obj_t *pAVar9;
  abctime aVar10;
  abctime aVar11;
  Hop_Obj_t *pHVar12;
  int nNodesBef;
  abctime clk;
  int i;
  int nGain;
  Abc_Obj_t *pObjNew;
  Abc_Obj_t *pLeaf;
  If_Obj_t *ppLeaves [16];
  If_Obj_t *pDriver;
  Kit_DsdObj_t *pRoot;
  Kit_DsdNtk_t *pNtk_local;
  Lpk_Cut_t *pCut_local;
  Lpk_Man_t *p_local;
  
  pKVar7 = Kit_DsdNtkRoot(pNtk);
  if (((uint)*pKVar7 >> 6 & 7) == 1) {
    iVar4 = Abc_LitIsCompl((uint)pNtk->Root);
    if (iVar4 == 0) {
      _i = Abc_NtkCreateNodeConst1(p->pNtk);
    }
    else {
      _i = Abc_NtkCreateNodeConst0(p->pNtk);
    }
    Abc_NtkUpdate(p->pObj,_i,p->vLevels);
    p->nGainTotal = ((*(uint *)pCut >> 6 & 0x3f) - (*(uint *)pCut >> 0xc & 0x3f)) + p->nGainTotal;
    p_local._4_4_ = 1;
  }
  else if (((uint)*pKVar7 >> 6 & 7) == 2) {
    pAVar2 = p->pNtk;
    iVar4 = Abc_Lit2Var((uint)*(ushort *)(pKVar7 + 1));
    _i = Abc_NtkObj(pAVar2,pCut->pLeaves[iVar4]);
    iVar4 = Abc_LitIsCompl((uint)pNtk->Root);
    iVar5 = Abc_LitIsCompl((uint)*(ushort *)(pKVar7 + 1));
    if (iVar4 != iVar5) {
      _i = Abc_NtkCreateNodeInv(p->pNtk,_i);
    }
    Abc_NtkUpdate(p->pObj,_i,p->vLevels);
    p->nGainTotal = ((*(uint *)pCut >> 6 & 0x3f) - (*(uint *)pCut >> 0xc & 0x3f)) + p->nGainTotal;
    p_local._4_4_ = 1;
  }
  else {
    if (((((uint)*pKVar7 >> 6 & 7) != 3) && (((uint)*pKVar7 >> 6 & 7) != 4)) &&
       (((uint)*pKVar7 >> 6 & 7) != 5)) {
      __assert_fail("pRoot->Type == KIT_DSD_AND || pRoot->Type == KIT_DSD_XOR || pRoot->Type == KIT_DSD_PRIME"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkCore.c"
                    ,0xa1,"int Lpk_ExploreCut(Lpk_Man_t *, Lpk_Cut_t *, Kit_DsdNtk_t *)");
    }
    if (p->pIfMan == (If_Man_t *)0x0) {
      Lpk_IfManStart(p);
    }
    If_ManRestart(p->pIfMan);
    for (clk._0_4_ = 0; (int)clk < p->pPars->nVarsMax; clk._0_4_ = (int)clk + 1) {
      pIVar8 = If_ManCreateCi(p->pIfMan);
      ppLeaves[(long)(int)clk + -1] = pIVar8;
    }
    for (clk._0_4_ = 0; (int)clk < (int)(*(uint *)pCut & 0x3f); clk._0_4_ = (int)clk + 1) {
      pAVar9 = Abc_NtkObj(p->pNtk,pCut->pLeaves[(int)clk]);
      p->pIfMan->pPars->pTimesArr[(int)clk] = (float)(*(uint *)&pAVar9->field_0x14 >> 0xc);
    }
    If_ManSetupCiCutSets(p->pIfMan);
    p->fCalledOnce = 0;
    p->nCalledSRed = 0;
    ppLeaves[0xf] = Lpk_MapTree_rec(p,pNtk,(If_Obj_t **)&pLeaf,(uint)pNtk->Root,(If_Obj_t *)0x0);
    if (ppLeaves[0xf] == (If_Obj_t *)0x0) {
      p_local._4_4_ = 0;
    }
    else {
      pIVar3 = p->pIfMan;
      pIVar8 = If_Regular(ppLeaves[0xf]);
      If_ManCreateCo(pIVar3,pIVar8);
      p->pIfMan->pPars->fAreaOnly = 1;
      aVar10 = Abc_Clock();
      If_ManPerformMappingComb(p->pIfMan);
      aVar11 = Abc_Clock();
      p->timeMap = (aVar11 - aVar10) + p->timeMap;
      uVar6 = ((*(uint *)pCut >> 6 & 0x3f) - (*(uint *)pCut >> 0xc & 0x3f)) -
              (int)p->pIfMan->AreaGlo;
      if (p->pPars->fVeryVerbose != 0) {
        printf("       Mffc = %2d. Mapped = %2d. Gain = %3d. Depth increase = %d. SReds = %d.\n",
               (ulong)((*(uint *)pCut >> 6 & 0x3f) - (*(uint *)pCut >> 0xc & 0x3f)),
               (ulong)(uint)(int)p->pIfMan->AreaGlo,(ulong)uVar6,
               (ulong)((int)p->pIfMan->RequiredGlo - (*(uint *)&p->pObj->field_0x14 >> 0xc)),
               (ulong)(uint)p->nCalledSRed);
      }
      if (((int)uVar6 < 1) && ((p->pPars->fZeroCost == 0 || (uVar6 != 0)))) {
        p_local._4_4_ = 0;
      }
      else {
        fVar1 = p->pIfMan->RequiredGlo;
        iVar4 = Abc_ObjRequiredLevel(p->pObj);
        if (iVar4 < (int)fVar1) {
          p_local._4_4_ = 0;
        }
        else {
          p->nGainTotal = uVar6 + p->nGainTotal;
          p->nChanges = p->nChanges + 1;
          if (p->nCalledSRed != 0) {
            p->nBenefited = p->nBenefited + 1;
          }
          Abc_NtkNodeNum(p->pNtk);
          If_ManCleanNodeCopy(p->pIfMan);
          If_ManCleanCutData(p->pIfMan);
          for (clk._0_4_ = 0; (int)clk < (int)(*(uint *)pCut & 0x3f); clk._0_4_ = (int)clk + 1) {
            pAVar9 = Abc_NtkObj(p->pNtk,pCut->pLeaves[(int)clk]);
            pIVar8 = If_ManCi(p->pIfMan,(int)clk);
            If_ObjSetCopy(pIVar8,pAVar9);
          }
          pAVar2 = p->pNtk;
          pIVar3 = p->pIfMan;
          pIVar8 = If_Regular(ppLeaves[0xf]);
          pAVar9 = Abc_NodeFromIf_rec(pAVar2,pIVar3,pIVar8,p->vCover);
          pHVar12 = (Hop_Obj_t *)(pAVar9->field_5).pData;
          iVar4 = If_IsComplement(ppLeaves[0xf]);
          pHVar12 = Hop_NotCond(pHVar12,iVar4);
          (pAVar9->field_5).pData = pHVar12;
          Abc_NtkUpdate(p->pObj,pAVar9,p->vLevels);
          p_local._4_4_ = 1;
        }
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int Lpk_ExploreCut( Lpk_Man_t * p, Lpk_Cut_t * pCut, Kit_DsdNtk_t * pNtk )
{
    extern Abc_Obj_t * Abc_NodeFromIf_rec( Abc_Ntk_t * pNtkNew, If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Int_t * vCover );
    Kit_DsdObj_t * pRoot;
    If_Obj_t * pDriver, * ppLeaves[16];
    Abc_Obj_t * pLeaf, * pObjNew;
    int nGain, i;
    abctime clk;
    int nNodesBef;
//    int nOldShared;

    // check special cases
    pRoot = Kit_DsdNtkRoot( pNtk );
    if ( pRoot->Type == KIT_DSD_CONST1 )
    {
        if ( Abc_LitIsCompl(pNtk->Root) )
            pObjNew = Abc_NtkCreateNodeConst0( p->pNtk );
        else
            pObjNew = Abc_NtkCreateNodeConst1( p->pNtk );
        Abc_NtkUpdate( p->pObj, pObjNew, p->vLevels );
        p->nGainTotal += pCut->nNodes - pCut->nNodesDup;
        return 1;
    }
    if ( pRoot->Type == KIT_DSD_VAR )
    {
        pObjNew = Abc_NtkObj( p->pNtk, pCut->pLeaves[ Abc_Lit2Var(pRoot->pFans[0]) ] );
        if ( Abc_LitIsCompl(pNtk->Root) ^ Abc_LitIsCompl(pRoot->pFans[0]) )
            pObjNew = Abc_NtkCreateNodeInv( p->pNtk, pObjNew );
        Abc_NtkUpdate( p->pObj, pObjNew, p->vLevels );
        p->nGainTotal += pCut->nNodes - pCut->nNodesDup;
        return 1;
    }
    assert( pRoot->Type == KIT_DSD_AND || pRoot->Type == KIT_DSD_XOR || pRoot->Type == KIT_DSD_PRIME );

    // start the mapping manager
    if ( p->pIfMan == NULL )
        Lpk_IfManStart( p );

    // prepare the mapping manager
    If_ManRestart( p->pIfMan );
    // create the PI variables
    for ( i = 0; i < p->pPars->nVarsMax; i++ )
        ppLeaves[i] = If_ManCreateCi( p->pIfMan );
    // set the arrival times
    Lpk_CutForEachLeaf( p->pNtk, pCut, pLeaf, i )
        p->pIfMan->pPars->pTimesArr[i] = (float)pLeaf->Level;
    // prepare the PI cuts
    If_ManSetupCiCutSets( p->pIfMan );
    // create the internal nodes
    p->fCalledOnce = 0;
    p->nCalledSRed = 0;
    pDriver = Lpk_MapTree_rec( p, pNtk, ppLeaves, pNtk->Root, NULL );
    if ( pDriver == NULL )
        return 0;
    // create the PO node
    If_ManCreateCo( p->pIfMan, If_Regular(pDriver) );

    // perform mapping
    p->pIfMan->pPars->fAreaOnly = 1;
clk = Abc_Clock();
    If_ManPerformMappingComb( p->pIfMan );
p->timeMap += Abc_Clock() - clk;

    // compute the gain in area
    nGain = pCut->nNodes - pCut->nNodesDup - (int)p->pIfMan->AreaGlo;
    if ( p->pPars->fVeryVerbose )
        printf( "       Mffc = %2d. Mapped = %2d. Gain = %3d. Depth increase = %d. SReds = %d.\n", 
            pCut->nNodes - pCut->nNodesDup, (int)p->pIfMan->AreaGlo, nGain, (int)p->pIfMan->RequiredGlo - (int)p->pObj->Level, p->nCalledSRed );

    // quit if there is no gain
    if ( !(nGain > 0 || (p->pPars->fZeroCost && nGain == 0)) )
        return 0;

    // quit if depth increases too much
    if ( (int)p->pIfMan->RequiredGlo > Abc_ObjRequiredLevel(p->pObj) )
        return 0;

    // perform replacement
    p->nGainTotal += nGain;
    p->nChanges++;
    if ( p->nCalledSRed )
        p->nBenefited++;

    nNodesBef = Abc_NtkNodeNum(p->pNtk);
    // prepare the mapping manager
    If_ManCleanNodeCopy( p->pIfMan );
    If_ManCleanCutData( p->pIfMan );
    // set the PIs of the cut
    Lpk_CutForEachLeaf( p->pNtk, pCut, pLeaf, i )
        If_ObjSetCopy( If_ManCi(p->pIfMan, i), pLeaf );
    // get the area of mapping
    pObjNew = Abc_NodeFromIf_rec( p->pNtk, p->pIfMan, If_Regular(pDriver), p->vCover );
    pObjNew->pData = Hop_NotCond( (Hop_Obj_t *)pObjNew->pData, If_IsComplement(pDriver) );
    // perform replacement
    Abc_NtkUpdate( p->pObj, pObjNew, p->vLevels );
//printf( "%3d : %d-%d=%d(%d) \n", p->nChanges, nNodesBef, Abc_NtkNodeNum(p->pNtk), nNodesBef-Abc_NtkNodeNum(p->pNtk), nGain );
    return 1;
}